

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

void __thiscall Camera::move_up(Camera *this,float delta_time)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  fVar1 = (this->direction).field_2.z;
  fVar2 = this->speed;
  uVar3 = (this->position).field_0;
  uVar5 = (this->position).field_1;
  uVar4 = (this->direction).field_0;
  uVar6 = (this->direction).field_1;
  (this->position).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
       (fVar2 * delta_time * (float)uVar4 + (float)uVar3);
  (this->position).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (fVar2 * delta_time * (float)uVar6 + (float)uVar5);
  (this->position).field_2.z = fVar1 * delta_time * fVar2 + (this->position).field_2.z;
  return;
}

Assistant:

void Camera::move_up(float delta_time) {
    position += direction * delta_time * speed;
}